

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O3

void __thiscall
testing::StrictMock<solitaire::archivers::SnapshotMock>::StrictMock
          (StrictMock<solitaire::archivers::SnapshotMock> *this)

{
  FunctionMocker<void_()> *this_00;
  
  Mock::FailUninterestingCalls(this);
  this_00 = &(this->super_SnapshotMock).gmock10_restore_10;
  memset(this_00,0,0x90);
  (this->super_SnapshotMock).super_Snapshot._vptr_Snapshot =
       (_func_int **)&PTR__SnapshotMock_0031c8f0;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&this_00->super_UntypedFunctionMockerBase);
  (this->super_SnapshotMock).gmock10_restore_10.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00318328;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_SnapshotMock).gmock11_isSnapshotOfSameObject_12.
              super_UntypedFunctionMockerBase);
  (this->super_SnapshotMock).gmock11_isSnapshotOfSameObject_12.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_0031c920;
  (this->super_SnapshotMock).super_Snapshot._vptr_Snapshot = (_func_int **)&PTR__StrictMock_0031c850
  ;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }